

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::stmt_code(SystemVerilogCodeGen *this,AuxiliaryStmt *stmt)

{
  anon_class_8_1_8991fb9c this_00;
  char cVar1;
  AuxiliaryType AVar2;
  UserException *this_01;
  element_type *this_02;
  SystemVerilogCodeGen *this_03;
  ostream *poVar3;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
  local_108;
  string local_e8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
  local_c8;
  string local_a8;
  anon_class_8_1_8991fb9c local_88;
  anon_class_8_1_8991fb9c var_func;
  EventControl *event;
  Stmt *local_68;
  shared_ptr<kratos::EventDelayStmt> *delay;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  AuxiliaryStmt *local_18;
  AuxiliaryStmt *stmt_local;
  SystemVerilogCodeGen *this_local;
  
  local_18 = stmt;
  stmt_local = (AuxiliaryStmt *)this;
  AVar2 = AuxiliaryStmt::aux_type(stmt);
  if (AVar2 == EventTracing) {
    local_4d = 1;
    this_01 = (UserException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Auxiliary event tracing statement should not be in the codegen!"
               ,&local_39);
    UserException::UserException(this_01,&local_38);
    local_4d = 0;
    __cxa_throw(this_01,&UserException::typeinfo,UserException::~UserException);
  }
  if (AVar2 == Delay) {
    _delay = indent(this);
    std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                    &(this->stream_).super_stringstream.field_0x10,_delay);
    Stmt::as<kratos::EventDelayStmt>((Stmt *)&event);
    local_68 = (Stmt *)&event;
    this_02 = std::
              __shared_ptr_access<kratos::EventDelayStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::EventDelayStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&event);
    this_03 = (SystemVerilogCodeGen *)EventDelayStmt::event(this_02);
    local_88.this = this;
    var_func.this = this_03;
    if (*(EventControlType *)&this_03->indent_ == Delay) {
      std::function<std::__cxx11::string(kratos::Var_const*)>::
      function<kratos::SystemVerilogCodeGen::stmt_code(kratos::AuxiliaryStmt*)::__0&,void>
                ((function<std::__cxx11::string(kratos::Var_const*)> *)&local_c8,&local_88);
      EventControl::to_string(&local_a8,(EventControl *)this_03,&local_c8);
      std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,(string *)&local_a8)
      ;
      std::__cxx11::string::~string((string *)&local_a8);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
      ::~function(&local_c8);
    }
    else if (*(EventControlType *)&this_03->indent_ == Edge) {
      poVar3 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,"@(");
      this_00.this = var_func.this;
      std::function<std::__cxx11::string(kratos::Var_const*)>::
      function<kratos::SystemVerilogCodeGen::stmt_code(kratos::AuxiliaryStmt*)::__0&,void>
                ((function<std::__cxx11::string(kratos::Var_const*)> *)&local_108,&local_88);
      EventControl::to_string(&local_e8,(EventControl *)this_00.this,&local_108);
      poVar3 = std::operator<<(poVar3,(string *)&local_e8);
      std::operator<<(poVar3,')');
      std::__cxx11::string::~string((string *)&local_e8);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_kratos::Var_*)>
      ::~function(&local_108);
    }
    poVar3 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,';');
    cVar1 = Stream::endl(&this->stream_);
    std::operator<<(poVar3,cVar1);
    std::shared_ptr<kratos::EventDelayStmt>::~shared_ptr
              ((shared_ptr<kratos::EventDelayStmt> *)&event);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::stmt_code(AuxiliaryStmt* stmt) {
    switch (stmt->aux_type()) {
        case AuxiliaryType::EventTracing: {
            throw UserException("Auxiliary event tracing statement should not be in the codegen!");
        }
        case AuxiliaryType::Delay: {
            stream_ << indent();
            auto const& delay = stmt->as<EventDelayStmt>();
            auto const& event = delay->event();
            auto var_func = [this](const Var* var) { return stream_.var_str(var); };
            switch (event.type) {
                case EventControlType::Delay: {
                    stream_ << event.to_string(var_func);
                    break;
                }
                case EventControlType::Edge: {
                    stream_ << "@(" << event.to_string(var_func) << ')';
                    break;
                }
            }
            stream_ << ';' << stream_.endl();
        }
    }
}